

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

pair<slang::syntax::PragmaExpressionSyntax_*,_bool> __thiscall
slang::parsing::Preprocessor::parsePragmaExpression(Preprocessor *this)

{
  bool bVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar3;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar4;
  bool local_a1;
  SimplePragmaExpressionSyntax *local_a0;
  NameValuePragmaExpressionSyntax *local_98;
  NameValuePragmaExpressionSyntax *result;
  type_conflict2 *succeeded;
  type *expr;
  undefined1 local_78;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> local_70;
  undefined1 local_60 [8];
  Token equals;
  undefined1 local_40 [8];
  Token name;
  Token token;
  Preprocessor *this_local;
  bool local_10;
  
  join_0x00000010_0x00000000_ = peek(this);
  if (((TokenKind)name.info == Identifier) ||
     (bVar1 = LexerFacts::isKeyword((TokenKind)name.info), bVar1)) {
    _local_40 = consume(this);
    bVar2 = peekSameLine(this);
    bVar1 = false;
    if (bVar2) {
      join_0x00000010_0x00000000_ = peek(this);
      bVar1 = (TokenKind)equals.info == Equals;
    }
    if (bVar1) {
      _local_60 = consume(this);
      pVar3 = parsePragmaValue(this);
      expr = (type *)pVar3.first;
      local_78 = pVar3.second;
      local_70.first = (PragmaExpressionSyntax *)expr;
      local_70.second = (bool)local_78;
      succeeded = (type_conflict2 *)
                  std::get<0ul,slang::syntax::PragmaExpressionSyntax*,bool>(&local_70);
      result = (NameValuePragmaExpressionSyntax *)
               std::get<1ul,slang::syntax::PragmaExpressionSyntax*,bool>(&local_70);
      local_98 = BumpAllocator::
                 emplace<slang::syntax::NameValuePragmaExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PragmaExpressionSyntax&>
                           (this->alloc,(Token *)local_40,(Token *)local_60,
                            *(PragmaExpressionSyntax **)succeeded);
      std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
      pair<slang::syntax::NameValuePragmaExpressionSyntax_*&,_bool_&,_true>
                ((pair<slang::syntax::PragmaExpressionSyntax_*,_bool> *)&this_local,&local_98,
                 (bool *)result);
      pVar3._8_8_ = extraout_RDX;
      pVar3.first = (PragmaExpressionSyntax *)this_local;
    }
    else {
      local_a0 = BumpAllocator::
                 emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                           (this->alloc,(Token *)local_40);
      local_a1 = true;
      std::pair<slang::syntax::PragmaExpressionSyntax_*,_bool>::
      pair<slang::syntax::SimplePragmaExpressionSyntax_*,_bool,_true>
                ((pair<slang::syntax::PragmaExpressionSyntax_*,_bool> *)&this_local,&local_a0,
                 &local_a1);
      pVar3._8_8_ = extraout_RDX_00;
      pVar3.first = (PragmaExpressionSyntax *)this_local;
    }
  }
  else {
    pVar3 = parsePragmaValue(this);
    local_10 = pVar3.second;
  }
  this_local = (Preprocessor *)pVar3.first;
  pVar4._9_7_ = pVar3._9_7_;
  pVar4.second = local_10;
  pVar4.first = (PragmaExpressionSyntax *)this_local;
  return pVar4;
}

Assistant:

std::pair<PragmaExpressionSyntax*, bool> Preprocessor::parsePragmaExpression() {
    Token token = peek();
    if (token.kind == TokenKind::Identifier || LexerFacts::isKeyword(token.kind)) {
        auto name = consume();
        if (peekSameLine() && peek().kind == TokenKind::Equals) {
            auto equals = consume();
            auto [expr, succeeded] = parsePragmaValue();
            auto result = alloc.emplace<NameValuePragmaExpressionSyntax>(name, equals, *expr);
            return {result, succeeded};
        }

        return {alloc.emplace<SimplePragmaExpressionSyntax>(name), true};
    }

    return parsePragmaValue();
}